

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O0

void __thiscall cppcms::rpc::json_rpc_server::json_rpc_server(json_rpc_server *this,service *srv)

{
  undefined8 *in_RDI;
  service *in_stack_00000018;
  application *in_stack_00000020;
  
  application::application(in_stack_00000020,in_stack_00000018);
  *in_RDI = &PTR__json_rpc_server_0052f8a0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>_>
         *)0x44bea3);
  std::shared_ptr<cppcms::rpc::json_call>::shared_ptr
            ((shared_ptr<cppcms::rpc::json_call> *)0x44beb6);
  std::__cxx11::string::string((string *)(in_RDI + 0xd));
  booster::hold_ptr<cppcms::rpc::json_rpc_server::_data>::hold_ptr
            ((hold_ptr<cppcms::rpc::json_rpc_server::_data> *)(in_RDI + 0x11));
  return;
}

Assistant:

json_rpc_server::json_rpc_server(cppcms::service &srv) :
		application(srv)
	{	
	}